

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O2

string * rcg::storeImage(string *__return_storage_ptr__,string *name,ImgFmt fmt,Image *image,
                        size_t yoffset,size_t height)

{
  ulong uVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  uint64_t pixelformat;
  bool bVar3;
  ulong height_00;
  ostream *poVar4;
  IOException *this;
  char *__rhs;
  ulong uVar5;
  size_t k_1;
  string *this_00;
  char cVar6;
  uint8_t *row;
  size_t i;
  ulong uVar7;
  size_t k;
  size_t sVar8;
  ulong uVar9;
  int j;
  long lVar10;
  allocator local_291;
  ulong local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  uint8_t rgb [12];
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  ofstream out;
  undefined1 local_228 [24];
  int aiStack_210 [120];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (fmt == PNG) {
    anon_unknown_1::storeImagePNG((string *)&out,name,image,yoffset,height);
    this_00 = (string *)&out;
    goto LAB_0011eac7;
  }
  uVar1 = image->height;
  if (height == 0) {
    height = uVar1;
  }
  _Var2._M_head_impl =
       (image->pixel)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  local_290 = yoffset;
  if (uVar1 < yoffset) {
    local_290 = uVar1;
  }
  height_00 = uVar1 - local_290;
  if (height <= uVar1 - local_290) {
    height_00 = height;
  }
  uVar1 = image->width;
  sVar8 = image->xpadding;
  pixelformat = image->pixelformat;
  local_250 = local_240;
  local_248 = 0;
  local_240[0] = 0;
  if ((pixelformat == 0x1080001) || (pixelformat == 0x81080001)) {
LAB_0011e433:
    std::operator+(&local_288,name,".pgm");
    ensureNewFileName((string *)&out,&local_288);
    std::__cxx11::string::operator=((string *)&local_250,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&local_288);
    std::ofstream::ofstream(&out,(string *)&local_250,_S_bin);
    poVar4 = std::operator<<((ostream *)&out,"P5");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = (ostream *)std::ostream::operator<<(&out,0xff);
    std::operator<<(poVar4,"\n");
    sVar8 = 0;
    while ((sVar8 != height_00 && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0))) {
      for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
        std::streambuf::sputc((char)local_228);
      }
      sVar8 = sVar8 + 1;
    }
    std::ofstream::close();
LAB_0011eab0:
    std::ofstream::~ofstream(&out);
  }
  else {
    if ((pixelformat == 0x1100007) || (pixelformat == 0x11000b8)) {
      std::operator+(&local_288,name,".pgm");
      ensureNewFileName((string *)&out,&local_288);
      std::__cxx11::string::operator=((string *)&local_250,(string *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&local_288);
      std::ofstream::ofstream(&out,(string *)&local_250,_S_bin);
      poVar4 = std::operator<<((ostream *)&out,"P5");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = (ostream *)std::ostream::operator<<(&out,0xffff);
      std::operator<<(poVar4,"\n");
      cVar6 = (char)local_228;
      if (image->bigendian == false) {
        sVar8 = 0;
        while ((sVar8 != height_00 && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0)))
        {
          for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
            std::streambuf::sputc(cVar6);
            std::streambuf::sputc(cVar6);
          }
          sVar8 = sVar8 + 1;
        }
      }
      else {
        sVar8 = 0;
        while ((sVar8 != height_00 && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0)))
        {
          for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
            std::streambuf::sputc(cVar6);
            std::streambuf::sputc(cVar6);
          }
          sVar8 = sVar8 + 1;
        }
      }
      std::ofstream::close();
      goto LAB_0011eab0;
    }
    if (((pixelformat == 0x20c005a) || (pixelformat == 0x2100032)) || (pixelformat == 0x210003b)) {
      std::operator+(&local_288,name,".ppm");
      ensureNewFileName((string *)&out,&local_288);
      std::__cxx11::string::operator=((string *)&local_250,(string *)&out);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&local_288);
      std::ofstream::ofstream(&out,(string *)&local_250,_S_bin);
      poVar4 = std::operator<<((ostream *)&out,"P6");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = (ostream *)std::ostream::operator<<(&out,0xff);
      std::operator<<(poVar4,"\n");
      if (pixelformat == 0x20c005a) {
        uVar7 = (uVar1 >> 2) * 6;
      }
      else {
        uVar7 = uVar1 * 2 & 0xfffffffffffffff8;
      }
      row = _Var2._M_head_impl + local_290 * (uVar7 + sVar8);
      uVar5 = 0;
      while ((uVar5 != height_00 && (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0))) {
        local_290 = uVar5;
        for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 4) {
          if (pixelformat == 0x20c005a) {
            convYCbCr411toQuadRGB(rgb,row,(int)uVar9);
          }
          else {
            convYCbCr422toQuadRGB(rgb,row,(int)uVar9);
          }
          for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 1) {
            std::streambuf::sputc((char)local_228);
          }
        }
        row = row + uVar7 + sVar8;
        uVar5 = local_290 + 1;
      }
      std::ofstream::close();
      goto LAB_0011eab0;
    }
    if (pixelformat == 0x10800c6) goto LAB_0011e433;
    rgb._0_8_ = operator_new__(height_00 * uVar1 * 3);
    uVar7 = uVar1 * 3;
    if (pixelformat != 0x2180014) {
      uVar7 = uVar1;
    }
    bVar3 = convertImage((uint8_t *)rgb._0_8_,(uint8_t *)0x0,
                         _Var2._M_head_impl + (uVar7 + sVar8) * local_290,pixelformat,uVar1,
                         height_00,sVar8);
    if (!bVar3) {
      this = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_288,"storeImage(): Unsupported pixel format: ",&local_291);
      __rhs = GetPixelFormatName((PfncFormat)image->pixelformat);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &local_288,__rhs);
      anon_unknown_1::IOException::IOException(this,(string *)&out);
      __cxa_throw(this,&(anonymous_namespace)::IOException::typeinfo,
                  anon_unknown_1::IOException::~IOException);
    }
    std::operator+(&local_288,name,".ppm");
    ensureNewFileName((string *)&out,&local_288);
    std::__cxx11::string::operator=((string *)&local_250,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&local_288);
    std::ofstream::ofstream(&out,(string *)&local_250,_S_bin);
    poVar4 = std::operator<<((ostream *)&out,"P6");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = (ostream *)std::ostream::operator<<(&out,0xff);
    std::operator<<(poVar4,"\n");
    sVar8 = 0;
    while ((sVar8 != height_00 &&
           (uVar7 = uVar1, *(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0))) {
      while (bVar3 = uVar7 != 0, uVar7 = uVar7 - 1, bVar3) {
        cVar6 = (char)local_228;
        std::streambuf::sputc(cVar6);
        std::streambuf::sputc(cVar6);
        std::streambuf::sputc(cVar6);
      }
      sVar8 = sVar8 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)rgb);
  }
  this_00 = (string *)&local_250;
LAB_0011eac7:
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,this_00);
  std::__cxx11::string::~string(this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string storeImage(const std::string &name, ImgFmt fmt, const Image &image,
  size_t yoffset, size_t height)
{
  std::string ret;

  switch (fmt)
  {
    case PNG:
#ifdef INCLUDE_PNG
      ret=storeImagePNG(name, image, yoffset, height);
#else
      throw IOException("storeImage(): Support for PNG image file format is not compiled in!");
#endif
      break;

    default:
    case PNM:
      ret=storeImagePNM(name, image, yoffset, height);
      break;
  }

  return ret;
}